

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O3

bool __thiscall
glcts::ShaderBitfieldOperationCaseLdexp::test(ShaderBitfieldOperationCaseLdexp *this,Data *data)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  float fVar4;
  
  if (this->m_components < 1) {
    return true;
  }
  lVar2 = 0;
  do {
    fVar4 = ldexpf(data->inVec4[lVar2],data->inIvec4[lVar2]);
    fVar4 = fVar4 - data->outVec4[lVar2];
    uVar3 = -(uint)(-fVar4 <= fVar4);
    fVar4 = (float)(~uVar3 & (uint)-fVar4 | (uint)fVar4 & uVar3);
    bVar1 = fVar4 <= 0.0001;
    if (0.0001 < fVar4) {
      return bVar1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 < this->m_components);
  return bVar1;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			float expected = deFloatLdExp(data->inVec4[i], data->inIvec4[i]);
			if (deFloatAbs(expected - data->outVec4[i]) > 0.0001f)
			{
				return false;
			}
		}
		return true;
	}